

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindShowTable(Binder *this,ShowRef *ref)

{
  bool bVar1;
  optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte;
  long in_RDX;
  pointer *__ptr;
  string sql;
  string lname;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_88;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [16];
  string local_40;
  
  StringUtil::Lower(&local_40,(string *)(in_RDX + 0x68));
  local_60._M_allocated_capacity = (size_type)(local_80 + 0x30);
  local_60._8_8_ = 0;
  local_50[0] = 0;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_40,"\"databases\"");
  if (bVar1) {
    PragmaShowDatabases_abi_cxx11_();
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_40,"\"tables\"");
    if (bVar1) {
      PragmaShowTables_abi_cxx11_();
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_40,"\"variables\"");
      if (bVar1) {
        PragmaShowVariables_abi_cxx11_();
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_40,"__show_tables_expanded");
        if (bVar1) {
          PragmaShowTablesExpanded_abi_cxx11_();
        }
        else {
          PragmaShow((string *)local_80,(string *)(in_RDX + 0x68));
        }
      }
    }
  }
  ::std::__cxx11::string::operator=((string *)(local_80 + 0x20),(string *)local_80);
  ::std::__cxx11::string::~string((string *)local_80);
  CreateViewInfo::ParseSelect((CreateViewInfo *)local_80,(string *)(local_80 + 0x20));
  make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
            ((duckdb *)&local_88,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)local_80);
  cte.ptr = (CommonTableExpressionInfo *)
            unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
            operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_88);
  Bind(this,(SubqueryRef *)ref,cte);
  if (local_88._M_head_impl != (SubqueryRef *)0x0) {
    (*((local_88._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
  }
  if ((long *)local_80._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_80._0_8_ + 8))();
  }
  ::std::__cxx11::string::~string((string *)(local_80 + 0x20));
  ::std::__cxx11::string::~string((string *)&local_40);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindShowTable(ShowRef &ref) {
	auto lname = StringUtil::Lower(ref.table_name);

	string sql;
	if (lname == "\"databases\"") {
		sql = PragmaShowDatabases();
	} else if (lname == "\"tables\"") {
		sql = PragmaShowTables();
	} else if (lname == "\"variables\"") {
		sql = PragmaShowVariables();
	} else if (lname == "__show_tables_expanded") {
		sql = PragmaShowTablesExpanded();
	} else {
		sql = PragmaShow(ref.table_name);
	}
	auto select = CreateViewInfo::ParseSelect(sql);
	auto subquery = make_uniq<SubqueryRef>(std::move(select));
	return Bind(*subquery);
}